

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O2

Ptr __thiscall core::image::rescale_half_size_gaussian<float>(image *this,ConstPtr *img,float sigma)

{
  uint chans;
  element_type *peVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  invalid_argument *this_00;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  pointer pfVar14;
  long lVar15;
  long lVar16;
  uint height;
  int iVar17;
  int iVar18;
  pointer pfVar19;
  ulong uVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var21;
  uint uVar22;
  pointer pfVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  uint width;
  int iVar27;
  int iVar28;
  int iVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  Ptr PVar33;
  pointer local_90;
  long local_88;
  pointer local_80;
  long local_70;
  pointer local_38;
  
  peVar1 = (img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar27 = (peVar1->super_TypedImageBase<float>).super_ImageBase.w;
  if ((1 < iVar27) && (iVar28 = (peVar1->super_TypedImageBase<float>).super_ImageBase.h, 1 < iVar28)
     ) {
    chans = (peVar1->super_TypedImageBase<float>).super_ImageBase.c;
    lVar5 = (long)(int)chans;
    width = iVar27 + 1 >> 1;
    height = iVar28 + 1 >> 1;
    Image<float>::create();
    TypedImageBase<float>::allocate(*(TypedImageBase<float> **)this,width,height,chans);
    fVar32 = sigma * sigma + sigma * sigma;
    fVar30 = expf(-0.5 / fVar32);
    fVar31 = expf(-2.5 / fVar32);
    fVar32 = expf(-4.5 / fVar32);
    iVar3 = chans * iVar27;
    iVar28 = iVar28 + -1;
    iVar27 = iVar27 + -1;
    local_70 = 0;
    uVar8 = 0;
    if (0 < (int)chans) {
      uVar8 = (ulong)chans;
    }
    iVar18 = 2;
    iVar7 = 1;
    uVar22 = 0;
    uVar24 = 0;
    iVar25 = 0;
    while( true ) {
      p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      _Var13._M_pi = p_Var21;
      if (1 < (int)uVar22) {
        _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar22;
      }
      iVar29 = iVar28;
      if (iVar7 < iVar28) {
        iVar29 = iVar7;
      }
      iVar17 = iVar28;
      if (iVar18 < iVar28) {
        iVar17 = iVar18;
      }
      if (uVar24 == height) break;
      pfVar19 = (((img->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->super_TypedImageBase<float>).data.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pfVar14 = pfVar19 + ((int)_Var13._M_pi + -1) * iVar3;
      lVar9 = local_70 + (long)pfVar19;
      pfVar23 = pfVar19 + iVar29 * iVar3;
      pfVar19 = pfVar19 + iVar17 * iVar3;
      iVar17 = 0;
      iVar29 = 2;
      uVar20 = 0;
      local_90 = pfVar23;
      local_88 = lVar9;
      local_80 = pfVar14;
      local_38 = pfVar19;
      while( true ) {
        iVar12 = 1;
        if (1 < iVar17) {
          iVar12 = iVar17;
        }
        iVar26 = (int)p_Var21;
        iVar4 = iVar27;
        if (iVar26 < iVar27) {
          iVar4 = iVar26;
        }
        iVar6 = iVar27;
        if (iVar29 < iVar27) {
          iVar6 = iVar29;
        }
        if (uVar20 == width) break;
        lVar15 = (long)(int)((iVar12 + -1) * chans);
        lVar16 = (long)(int)(iVar4 * chans);
        lVar10 = (long)(int)(iVar6 * chans);
        lVar2 = *(long *)this;
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          *(float *)(*(long *)(lVar2 + 0x18) + (long)iVar25 * 4 + uVar11 * 4) =
               (pfVar19[lVar10 + uVar11] * fVar32 +
               pfVar19[lVar16 + uVar11] * fVar31 +
               local_38[uVar11] * fVar31 +
               pfVar19[lVar15 + uVar11] * fVar32 +
               pfVar23[lVar10 + uVar11] * fVar31 +
               pfVar23[lVar16 + uVar11] * fVar30 +
               local_90[uVar11] * fVar30 +
               pfVar23[lVar15 + uVar11] * fVar31 +
               *(float *)(lVar9 + lVar10 * 4 + uVar11 * 4) * fVar31 +
               *(float *)(lVar9 + lVar16 * 4 + uVar11 * 4) * fVar30 +
               *(float *)(local_88 + uVar11 * 4) * fVar30 +
               *(float *)(lVar9 + lVar15 * 4 + uVar11 * 4) * fVar31 +
               pfVar14[lVar10 + uVar11] * fVar32 +
               pfVar14[lVar16 + uVar11] * fVar31 +
               local_80[uVar11] * fVar31 + pfVar14[lVar15 + uVar11] * fVar32 + 0.0) /
               (fVar32 + 0.0 + fVar31 + fVar31 + fVar32 + fVar31 + fVar30 + fVar30 + fVar31 + fVar31
                + fVar30 + fVar30 + fVar31 + fVar32 + fVar31 + fVar31 + fVar32);
        }
        iVar25 = iVar25 + (int)uVar11;
        uVar20 = uVar20 + 1;
        iVar17 = iVar17 + 2;
        local_80 = local_80 + lVar5 * 2;
        local_88 = local_88 + lVar5 * 8;
        local_90 = local_90 + lVar5 * 2;
        local_38 = local_38 + lVar5 * 2;
        p_Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(iVar26 + 2);
        iVar29 = iVar29 + 2;
      }
      uVar24 = uVar24 + 1;
      uVar22 = uVar22 + 2;
      local_70 = local_70 + (long)iVar3 * 8;
      iVar7 = iVar7 + 2;
      iVar18 = iVar18 + 2;
    }
    PVar33.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var13._M_pi;
    PVar33.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar33.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid input image");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
rescale_half_size_gaussian (typename Image<T>::ConstPtr img, float sigma)
{
    int const iw = img->width();
    int const ih = img->height();
    int const ic = img->channels();
    int const ow = (iw + 1) >> 1;
    int const oh = (ih + 1) >> 1;

    if (iw < 2 || ih < 2)
        throw std::invalid_argument("Invalid input image");

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(ow, oh, ic);

    /*
     * Weights w1 (4 center px), w2 (8 skewed px) and w3 (4 corner px).
     * Weights can be normalized by dividing with (4*w1 + 8*w2 + 4*w3).
     * Since the accumulator is used, normalization is not explicit.
     */
    float const w1 = std::exp(-0.5f / (2.0f * MATH_POW2(sigma)));
    float const w2 = std::exp(-2.5f / (2.0f * MATH_POW2(sigma)));
    float const w3 = std::exp(-4.5f / (2.0f * MATH_POW2(sigma)));

    int outpos = 0;
    int const rowstride = iw * ic;
    for (int y = 0; y < oh; ++y)
    {
        /* Init the four row pointers. */
        int y2 = (int)y << 1;
        T const* row[4];
        row[0] = &img->at(std::max(0, y2 - 1) * rowstride);
        row[1] = &img->at(y2 * rowstride);
        row[2] = &img->at(std::min((int)ih - 1, y2 + 1) * rowstride);
        row[3] = &img->at(std::min((int)ih - 1, y2 + 2) * rowstride);

        for (int x = 0; x < ow; ++x)
        {
            /* Init four pixel positions for each row. */
            int x2 = (int)x << 1;
            int xi[4];
            xi[0] = std::max(0, x2 - 1) * ic;
            xi[1] = x2 * ic;
            xi[2] = std::min((int)iw - 1, x2 + 1) * ic;
            xi[3] = std::min((int)iw - 1, x2 + 2) * ic;

            /* Accumulate 16 values in each channel. */
            for (int c = 0; c < ic; ++c)
            {
                math::Accum<T> accum(T(0));
                accum.add(row[0][xi[0] + c], w3);
                accum.add(row[0][xi[1] + c], w2);
                accum.add(row[0][xi[2] + c], w2);
                accum.add(row[0][xi[3] + c], w3);

                accum.add(row[1][xi[0] + c], w2);
                accum.add(row[1][xi[1] + c], w1);
                accum.add(row[1][xi[2] + c], w1);
                accum.add(row[1][xi[3] + c], w2);

                accum.add(row[2][xi[0] + c], w2);
                accum.add(row[2][xi[1] + c], w1);
                accum.add(row[2][xi[2] + c], w1);
                accum.add(row[2][xi[3] + c], w2);

                accum.add(row[3][xi[0] + c], w3);
                accum.add(row[3][xi[1] + c], w2);
                accum.add(row[3][xi[2] + c], w2);
                accum.add(row[3][xi[3] + c], w3);

                out->at(outpos++) = accum.normalized();
            }
        }
    }

    return out;
}